

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

string * __thiscall
om::net::mac_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,mac_addr *this)

{
  ostream *poVar1;
  stringstream ss;
  long local_188 [2];
  undefined8 uStack_178;
  uint auStack_170 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
  *(undefined8 *)((long)&uStack_178 + *(long *)(local_188[0] + -0x18)) = 2;
  poVar1 = std::operator<<(local_188,0x30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_addr[0]);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_addr[1]);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_addr[2]);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_addr[3]);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_addr[4]);
  poVar1 = std::operator<<(poVar1,':');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  std::ostream::operator<<(poVar1,(uint)this->_addr[5]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << std::hex
				   << std::setw(2) << std::setfill('0') << (int) _addr[0] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[1] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[2] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[3] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[4] << ':'
				   << std::setw(2) << std::setfill('0') << (int) _addr[5];
				return ss.str();
			}